

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

TypeAliasType *
slang::ast::TypeAliasType::fromSyntax(Scope *scope,ClassPropertyDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  MemberSyntax *this;
  TypeAliasType *pTVar2;
  iterator iVar3;
  reference pTVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *in_RDI;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  TypeAliasType *result;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff98;
  short in_stack_ffffffffffffff9e;
  Scope *in_stack_ffffffffffffffb8;
  Symbol *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  in_stack_ffffffffffffffd8;
  Scope *in_stack_ffffffffffffffe0;
  
  this = not_null<slang::syntax::MemberSyntax_*>::operator->
                   ((not_null<slang::syntax::MemberSyntax_*> *)0x9f3be9);
  slang::syntax::SyntaxNode::as<slang::syntax::TypedefDeclarationSyntax>(&this->super_SyntaxNode);
  pTVar2 = fromSyntax(in_stack_ffffffffffffffe0,
                      (TypedefDeclarationSyntax *)in_stack_ffffffffffffffd8._M_current);
  std::span<slang::parsing::Token,_18446744073709551615UL>::begin(in_stack_ffffffffffffff88);
  iVar3 = std::span<slang::parsing::Token,_18446744073709551615UL>::end
                    ((span<slang::parsing::Token,_18446744073709551615UL> *)
                     CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  while (bVar1 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           (in_stack_ffffffffffffff90,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                          *)&stack0xffffffffffffffd8);
    in_stack_ffffffffffffffb8 = *(Scope **)pTVar4;
    in_stack_ffffffffffffffc0 = (Symbol *)pTVar4->info;
    in_stack_ffffffffffffff9e = (short)in_stack_ffffffffffffffb8;
    if (in_stack_ffffffffffffff9e == 0xd1) {
      pTVar2->visibility = Local;
    }
    else if (in_stack_ffffffffffffff9e == 0xf1) {
      pTVar2->visibility = Protected;
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffd8);
  }
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            (in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                    CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  syntax_00._M_extent._M_extent_value = (size_t)iVar3._M_current;
  syntax_00._M_ptr = in_stack_ffffffffffffffc8;
  Symbol::setAttributes(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,syntax_00);
  return pTVar2;
}

Assistant:

TypeAliasType& TypeAliasType::fromSyntax(const Scope& scope,
                                         const ClassPropertyDeclarationSyntax& syntax) {
    auto& result = fromSyntax(scope, syntax.declaration->as<TypedefDeclarationSyntax>());
    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                result.visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                result.visibility = Visibility::Protected;
                break;
            default:
                // Everything else is not allowed on typedefs; the parser will issue
                // a diagnostic so just ignore them here.
                break;
        }
    }

    result.setAttributes(scope, syntax.attributes);
    return result;
}